

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

void al_set_new_bitmap_flags(int flags)

{
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar2 = *plVar1;
    if (lVar2 == 0) {
      return;
    }
  }
  *(int *)(lVar2 + 0x10c) = flags;
  return;
}

Assistant:

void al_set_new_bitmap_flags(int flags)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   tls->new_bitmap_flags = flags;
}